

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

UInt __thiscall Json::Value::asUInt(Value *this)

{
  bool bVar1;
  string local_688;
  ostringstream local_668 [8];
  ostringstream oss_3;
  string local_4f0;
  ostringstream local_4d0 [8];
  ostringstream oss_2;
  string local_358;
  ostringstream local_338 [8];
  ostringstream oss_1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream oss;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local._4_4_ = 0;
    break;
  case 1:
    bVar1 = isUInt(this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"LargestInt out of UInt range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_1c0);
    }
    this_local._4_4_ = (uint)(this->value_).uint_;
    break;
  case 2:
    bVar1 = isUInt(this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_338);
      std::operator<<((ostream *)local_338,"LargestUInt out of UInt range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_358);
    }
    this_local._4_4_ = (uint)(this->value_).uint_;
    break;
  case 3:
    bVar1 = InRange<int,unsigned_int>((this->value_).real_,0,0xffffffff);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4d0);
      std::operator<<((ostream *)local_4d0,"double out of UInt range");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_4f0);
    }
    this_local._4_4_ = (uint)(long)(this->value_).real_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_668);
    std::operator<<((ostream *)local_668,"Value is not convertible to UInt.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_688);
  case 5:
    this_local._4_4_ = (uint)(((this->value_).bool_ & 1U) != 0);
  }
  return this_local._4_4_;
}

Assistant:

Value::UInt Value::asUInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestInt out of UInt range");
    return UInt(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestUInt out of UInt range");
    return UInt(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt),
                        "double out of UInt range");
    return UInt(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to UInt.");
}